

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

ssize_t __thiscall QIODevice::write(QIODevice *this,int __fd,void *__buf,size_t __n)

{
  QIODevicePrivate *this_00;
  bool bVar1;
  int iVar2;
  long length;
  undefined4 in_register_00000034;
  undefined1 auVar3 [16];
  int extraout_var;
  
  length = -1;
  if ((-1 < (long)__buf) &&
     (this_00 = (this->d_ptr)._M_t.
                super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t
                .super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
                super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl,
     ((this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 2) != 0)) {
    bVar1 = QIODevicePrivate::isSequential(this_00);
    if ((!bVar1) &&
       ((this_00->pos != this_00->devicePos &&
        (iVar2 = (*this->_vptr_QIODevice[7])(this), (char)iVar2 == '\0')))) {
      return -1;
    }
    iVar2 = (*this->_vptr_QIODevice[0x12])(this,CONCAT44(in_register_00000034,__fd),__buf);
    length = CONCAT44(extraout_var,iVar2);
    if (!bVar1 && (length != 0 && -1 < extraout_var)) {
      auVar3._0_8_ = CONCAT44(extraout_var,iVar2);
      auVar3._8_4_ = iVar2;
      auVar3._12_4_ = extraout_var;
      this_00->pos = auVar3._0_8_ + this_00->pos;
      this_00->devicePos = auVar3._8_8_ + this_00->devicePos;
      QIODevicePrivate::QRingBufferRef::skip(&this_00->buffer,length);
    }
  }
  return length;
}

Assistant:

qint64 QIODevice::write(const char *data, qint64 maxSize)
{
    Q_D(QIODevice);
    CHECK_WRITABLE(write, qint64(-1));
    CHECK_MAXLEN(write, qint64(-1));

    const bool sequential = d->isSequential();
    // Make sure the device is positioned correctly.
    if (d->pos != d->devicePos && !sequential && !seek(d->pos))
        return qint64(-1);

#ifdef Q_OS_WIN
    if (d->openMode & Text) {
        const char *endOfData = data + maxSize;
        const char *startOfBlock = data;

        qint64 writtenSoFar = 0;
        const qint64 savedPos = d->pos;

        forever {
            const char *endOfBlock = startOfBlock;
            while (endOfBlock < endOfData && *endOfBlock != '\n')
                ++endOfBlock;

            qint64 blockSize = endOfBlock - startOfBlock;
            if (blockSize > 0) {
                qint64 ret = writeData(startOfBlock, blockSize);
                if (ret <= 0) {
                    if (writtenSoFar && !sequential)
                        d->buffer.skip(d->pos - savedPos);
                    return writtenSoFar ? writtenSoFar : ret;
                }
                if (!sequential) {
                    d->pos += ret;
                    d->devicePos += ret;
                }
                writtenSoFar += ret;
            }

            if (endOfBlock == endOfData)
                break;

            qint64 ret = writeData("\r\n", 2);
            if (ret <= 0) {
                if (writtenSoFar && !sequential)
                    d->buffer.skip(d->pos - savedPos);
                return writtenSoFar ? writtenSoFar : ret;
            }
            if (!sequential) {
                d->pos += ret;
                d->devicePos += ret;
            }
            ++writtenSoFar;

            startOfBlock = endOfBlock + 1;
        }

        if (writtenSoFar && !sequential)
            d->buffer.skip(d->pos - savedPos);
        return writtenSoFar;
    }
#endif

    qint64 written = writeData(data, maxSize);
    if (!sequential && written > 0) {
        d->pos += written;
        d->devicePos += written;
        d->buffer.skip(written);
    }
    return written;
}